

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

void __thiscall ghc::filesystem::path::append_name(path *this,value_type *name)

{
  size_type sVar1;
  size_t sVar2;
  long *local_40 [2];
  long local_30 [2];
  
  sVar1 = (this->_path)._M_string_length;
  if (sVar1 != 0) {
    if ((this->_path)._M_dataplus._M_p[sVar1 - 1] != '/') {
      std::__cxx11::string::push_back((char)this);
    }
    std::__cxx11::string::append((char *)this);
    return;
  }
  sVar2 = strlen(name);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,name,name + sVar2);
  postprocess_path_with_format((path *)local_40,(format)name);
  operator/=(this,(path *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

GHC_INLINE void path::append_name(const value_type* name)
{
    if (_path.empty()) {
        this->operator/=(path(name));
    }
    else {
        if (_path.back() != path::preferred_separator) {
            _path.push_back(path::preferred_separator);
        }
        _path += name;
        check_long_path();
    }
}